

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O2

void __thiscall Imaginer::Utils::iRpn::~iRpn(iRpn *this)

{
  iStack<char> *this_00;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_01;
  
  this_00 = this->_operator;
  if (this_00 != (iStack<char> *)0x0) {
    iStack<char>::~iStack(this_00);
    operator_delete(this_00,0x10);
    this->_operator = (iStack<char> *)0x0;
  }
  this_01 = this->_operands;
  if (this_01 != (iStack<Imaginer::Utils::iRpn::RPNnode> *)0x0) {
    iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack(this_01);
    operator_delete(this_01,0x10);
    this->_operands = (iStack<Imaginer::Utils::iRpn::RPNnode> *)0x0;
  }
  return;
}

Assistant:

iRpn::~iRpn()
{
    //(_operator) ? (delete _operator,_operator = NULL) : (_operator);
    if(_operator)
    {
        delete _operator;
        _operator = NULL;
    }
    //(_operands) ? (delete _operands,_operands = NULL) : (_operands);
    if(_operands)
    {
        delete _operands;
        _operands = NULL;
    }
}